

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O3

void ncnn::copy_make_border_image<float>(Mat *src,Mat *dst,int top,int left,int type,float v)

{
  uint uVar1;
  int iVar2;
  undefined4 uVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  undefined4 *puVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  void *pvVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar27;
  int iVar34;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined4 *local_a8;
  long local_a0;
  
  auVar41 = _DAT_005ae850;
  auVar49 = _DAT_005a3350;
  auVar48 = _DAT_005a3340;
  auVar47 = _DAT_005a3240;
  uVar16 = (ulong)(uint)left;
  uVar1 = dst->w;
  lVar6 = (long)(int)uVar1;
  iVar2 = dst->h;
  local_a8 = (undefined4 *)src->data;
  pvVar19 = dst->data;
  if (type == 0) {
    if (top < 1) {
      iVar18 = 0;
    }
    else {
      lVar13 = (ulong)uVar1 - 1;
      auVar50._8_4_ = (int)lVar13;
      auVar50._0_8_ = lVar13;
      auVar50._12_4_ = (int)((ulong)lVar13 >> 0x20);
      iVar10 = 0;
      auVar50 = auVar50 ^ _DAT_005a3240;
      do {
        if (0 < (int)uVar1) {
          lVar13 = 0;
          auVar37 = auVar49;
          auVar40 = auVar48;
          do {
            auVar46 = auVar37 ^ auVar47;
            iVar18 = auVar50._4_4_;
            if ((bool)(~(auVar46._4_4_ == iVar18 && auVar50._0_4_ < auVar46._0_4_ ||
                        iVar18 < auVar46._4_4_) & 1)) {
              *(float *)((long)pvVar19 + lVar13) = v;
            }
            if ((auVar46._12_4_ != auVar50._12_4_ || auVar46._8_4_ <= auVar50._8_4_) &&
                auVar46._12_4_ <= auVar50._12_4_) {
              *(float *)((long)pvVar19 + lVar13 + 4) = v;
            }
            auVar46 = auVar40 ^ auVar47;
            iVar27 = auVar46._4_4_;
            if (iVar27 <= iVar18 && (iVar27 != iVar18 || auVar46._0_4_ <= auVar50._0_4_)) {
              *(float *)((long)pvVar19 + lVar13 + 8) = v;
              *(float *)((long)pvVar19 + lVar13 + 0xc) = v;
            }
            lVar14 = auVar41._0_8_;
            lVar15 = auVar37._8_8_;
            auVar37._0_8_ = auVar37._0_8_ + lVar14;
            lVar11 = auVar41._8_8_;
            auVar37._8_8_ = lVar15 + lVar11;
            lVar15 = auVar40._8_8_;
            auVar40._0_8_ = auVar40._0_8_ + lVar14;
            auVar40._8_8_ = lVar15 + lVar11;
            lVar13 = lVar13 + 0x10;
          } while ((ulong)(uVar1 + 3 >> 2) << 4 != lVar13);
        }
        pvVar19 = (void *)((long)pvVar19 + lVar6 * 4);
        iVar10 = iVar10 + 1;
        iVar18 = top;
      } while (iVar10 != top);
    }
    if (iVar18 < src->h + top) {
      lVar13 = (ulong)(uint)left - 1;
      auVar41._8_4_ = (int)lVar13;
      auVar41._0_8_ = lVar13;
      auVar41._12_4_ = (int)((ulong)lVar13 >> 0x20);
      local_a0 = (long)pvVar19 + 0xc;
      auVar41 = auVar41 ^ _DAT_005a3240;
      auVar47 = _DAT_005a3340;
      auVar48 = _DAT_005a3350;
      auVar49 = _DAT_005a3240;
      do {
        uVar7 = 0;
        if (0 < left) {
          lVar13 = 0;
          auVar46 = auVar47;
          auVar36 = auVar48;
          do {
            auVar50 = auVar36 ^ auVar49;
            iVar10 = auVar41._4_4_;
            if ((bool)(~(auVar50._4_4_ == iVar10 && auVar41._0_4_ < auVar50._0_4_ ||
                        iVar10 < auVar50._4_4_) & 1)) {
              *(float *)((long)pvVar19 + lVar13) = v;
            }
            if ((auVar50._12_4_ != auVar41._12_4_ || auVar50._8_4_ <= auVar41._8_4_) &&
                auVar50._12_4_ <= auVar41._12_4_) {
              *(float *)((long)pvVar19 + lVar13 + 4) = v;
            }
            iVar27 = SUB164(auVar46 ^ auVar49,4);
            if (iVar27 <= iVar10 &&
                (iVar27 != iVar10 || SUB164(auVar46 ^ auVar49,0) <= auVar41._0_4_)) {
              *(float *)((long)pvVar19 + lVar13 + 8) = v;
              *(float *)((long)pvVar19 + lVar13 + 0xc) = v;
            }
            lVar14 = auVar36._8_8_;
            auVar36._0_8_ = auVar36._0_8_ + 4;
            auVar36._8_8_ = lVar14 + 4;
            lVar14 = auVar46._8_8_;
            auVar46._0_8_ = auVar46._0_8_ + 4;
            auVar46._8_8_ = lVar14 + 4;
            lVar13 = lVar13 + 0x10;
            uVar7 = uVar16;
          } while ((ulong)(left + 3U >> 2) << 4 != lVar13);
        }
        iVar10 = src->w;
        uVar17 = (uint)uVar7;
        if ((long)iVar10 < 0xc) {
          uVar5 = iVar10 + left;
          if ((int)uVar17 < (int)uVar5) {
            do {
              *(undefined4 *)((long)pvVar19 + uVar7 * 4) = local_a8[uVar7 - (long)left];
              uVar7 = uVar7 + 1;
              uVar17 = uVar5;
            } while (uVar5 != uVar7);
          }
        }
        else {
          memcpy((void *)((long)pvVar19 + (long)left * 4),local_a8,(long)iVar10 << 2);
          iVar10 = src->w;
          auVar47 = _DAT_005a3340;
          auVar48 = _DAT_005a3350;
          auVar49 = _DAT_005a3240;
          uVar17 = uVar17 + iVar10;
        }
        if ((int)uVar17 < (int)uVar1) {
          lVar14 = lVar6 - (int)uVar17;
          lVar13 = lVar14 + -1;
          auVar38._8_4_ = (int)lVar13;
          auVar38._0_8_ = lVar13;
          auVar38._12_4_ = (int)((ulong)lVar13 >> 0x20);
          lVar13 = local_a0 + (long)(int)uVar17 * 4;
          uVar7 = 0;
          do {
            auVar20._8_4_ = (int)uVar7;
            auVar20._0_8_ = uVar7;
            auVar20._12_4_ = (int)(uVar7 >> 0x20);
            auVar50 = (auVar20 | auVar48) ^ auVar49;
            iVar27 = SUB164(auVar38 ^ auVar49,0);
            bVar4 = iVar27 < auVar50._0_4_;
            iVar34 = SUB164(auVar38 ^ auVar49,4);
            iVar35 = auVar50._4_4_;
            if ((iVar34 < iVar35 || iVar35 == iVar34 && bVar4) != true) {
              *(float *)(lVar13 + -0xc + uVar7 * 4) = v;
            }
            if (iVar34 >= iVar35 && (iVar35 != iVar34 || !bVar4)) {
              *(float *)(lVar13 + -8 + uVar7 * 4) = v;
            }
            auVar50 = (auVar20 | auVar47) ^ auVar49;
            iVar35 = auVar50._4_4_;
            if (iVar35 <= iVar34 && (iVar35 != iVar34 || auVar50._0_4_ <= iVar27)) {
              *(float *)(lVar13 + -4 + uVar7 * 4) = v;
              *(float *)(lVar13 + uVar7 * 4) = v;
            }
            uVar7 = uVar7 + 4;
          } while ((lVar14 + 3U & 0xfffffffffffffffc) != uVar7);
        }
        local_a8 = local_a8 + iVar10;
        pvVar19 = (void *)((long)pvVar19 + lVar6 * 4);
        iVar18 = iVar18 + 1;
        local_a0 = local_a0 + lVar6 * 4;
      } while (iVar18 < src->h + top);
    }
    auVar41 = _DAT_005ae850;
    auVar49 = _DAT_005a3350;
    auVar48 = _DAT_005a3340;
    auVar47 = _DAT_005a3240;
    if (iVar18 < iVar2) {
      lVar13 = (ulong)uVar1 - 1;
      auVar51._8_4_ = (int)lVar13;
      auVar51._0_8_ = lVar13;
      auVar51._12_4_ = (int)((ulong)lVar13 >> 0x20);
      auVar51 = auVar51 ^ _DAT_005a3240;
      do {
        if (0 < (int)uVar1) {
          lVar13 = 0;
          auVar39 = auVar49;
          auVar42 = auVar48;
          do {
            auVar50 = auVar39 ^ auVar47;
            iVar10 = auVar51._4_4_;
            if ((bool)(~(auVar50._4_4_ == iVar10 && auVar51._0_4_ < auVar50._0_4_ ||
                        iVar10 < auVar50._4_4_) & 1)) {
              *(float *)((long)pvVar19 + lVar13) = v;
            }
            if ((auVar50._12_4_ != auVar51._12_4_ || auVar50._8_4_ <= auVar51._8_4_) &&
                auVar50._12_4_ <= auVar51._12_4_) {
              *(float *)((long)pvVar19 + lVar13 + 4) = v;
            }
            auVar50 = auVar42 ^ auVar47;
            iVar27 = auVar50._4_4_;
            if (iVar27 <= iVar10 && (iVar27 != iVar10 || auVar50._0_4_ <= auVar51._0_4_)) {
              *(float *)((long)pvVar19 + lVar13 + 8) = v;
              *(float *)((long)pvVar19 + lVar13 + 0xc) = v;
            }
            lVar14 = auVar41._0_8_;
            lVar15 = auVar39._8_8_;
            auVar39._0_8_ = auVar39._0_8_ + lVar14;
            lVar11 = auVar41._8_8_;
            auVar39._8_8_ = lVar15 + lVar11;
            lVar15 = auVar42._8_8_;
            auVar42._0_8_ = auVar42._0_8_ + lVar14;
            auVar42._8_8_ = lVar15 + lVar11;
            lVar13 = lVar13 + 0x10;
          } while ((ulong)(uVar1 + 3 >> 2) << 4 != lVar13);
        }
        pvVar19 = (void *)((long)pvVar19 + lVar6 * 4);
        iVar18 = iVar18 + 1;
      } while (iVar18 != iVar2);
    }
  }
  puVar9 = local_a8;
  if (type == 1) {
    if (top < 1) {
      local_a0._0_4_ = 0;
    }
    else {
      lVar13 = uVar16 - 1;
      auVar43._8_4_ = (int)lVar13;
      auVar43._0_8_ = lVar13;
      auVar43._12_4_ = (int)((ulong)lVar13 >> 0x20);
      lVar13 = (long)pvVar19 + 0xc;
      iVar18 = 0;
      auVar43 = auVar43 ^ _DAT_005a3240;
      auVar47 = _DAT_005a3340;
      auVar48 = _DAT_005a3350;
      auVar49 = _DAT_005a3240;
      do {
        uVar7 = 0;
        if (0 < left) {
          uVar3 = *local_a8;
          lVar14 = 0;
          auVar21 = auVar48;
          auVar28 = auVar47;
          do {
            auVar41 = auVar21 ^ auVar49;
            iVar10 = auVar43._4_4_;
            if ((bool)(~(auVar41._4_4_ == iVar10 && auVar43._0_4_ < auVar41._0_4_ ||
                        iVar10 < auVar41._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar19 + lVar14) = uVar3;
            }
            if ((auVar41._12_4_ != auVar43._12_4_ || auVar41._8_4_ <= auVar43._8_4_) &&
                auVar41._12_4_ <= auVar43._12_4_) {
              *(undefined4 *)((long)pvVar19 + lVar14 + 4) = uVar3;
            }
            iVar27 = SUB164(auVar28 ^ auVar49,4);
            if (iVar27 <= iVar10 &&
                (iVar27 != iVar10 || SUB164(auVar28 ^ auVar49,0) <= auVar43._0_4_)) {
              *(undefined4 *)((long)pvVar19 + lVar14 + 8) = uVar3;
              *(undefined4 *)((long)pvVar19 + lVar14 + 0xc) = uVar3;
            }
            lVar11 = auVar21._8_8_;
            auVar21._0_8_ = auVar21._0_8_ + 4;
            auVar21._8_8_ = lVar11 + 4;
            lVar11 = auVar28._8_8_;
            auVar28._0_8_ = auVar28._0_8_ + 4;
            auVar28._8_8_ = lVar11 + 4;
            lVar14 = lVar14 + 0x10;
            uVar7 = uVar16;
          } while ((ulong)(left + 3U >> 2) << 4 != lVar14);
        }
        iVar10 = src->w;
        uVar17 = (uint)uVar7;
        if ((long)iVar10 < 0xc) {
          uVar5 = iVar10 + left;
          if ((int)uVar17 < (int)uVar5) {
            do {
              *(undefined4 *)((long)pvVar19 + uVar7 * 4) = local_a8[uVar7 - (long)left];
              uVar7 = uVar7 + 1;
              uVar17 = uVar5;
            } while (uVar5 != uVar7);
          }
        }
        else {
          memcpy((void *)((long)pvVar19 + (long)left * 4),local_a8,(long)iVar10 << 2);
          iVar10 = src->w;
          auVar47 = _DAT_005a3340;
          auVar48 = _DAT_005a3350;
          auVar49 = _DAT_005a3240;
          uVar17 = uVar17 + iVar10;
        }
        if ((int)uVar17 < (int)uVar1) {
          uVar3 = local_a8[(long)iVar10 + -1];
          lVar11 = lVar6 - (int)uVar17;
          lVar14 = lVar11 + -1;
          auVar22._8_4_ = (int)lVar14;
          auVar22._0_8_ = lVar14;
          auVar22._12_4_ = (int)((ulong)lVar14 >> 0x20);
          lVar14 = lVar13 + (long)(int)uVar17 * 4;
          uVar7 = 0;
          do {
            auVar29._8_4_ = (int)uVar7;
            auVar29._0_8_ = uVar7;
            auVar29._12_4_ = (int)(uVar7 >> 0x20);
            auVar41 = (auVar29 | auVar48) ^ auVar49;
            iVar10 = SUB164(auVar22 ^ auVar49,0);
            bVar4 = iVar10 < auVar41._0_4_;
            iVar27 = SUB164(auVar22 ^ auVar49,4);
            iVar34 = auVar41._4_4_;
            if ((iVar27 < iVar34 || iVar34 == iVar27 && bVar4) != true) {
              *(undefined4 *)(lVar14 + -0xc + uVar7 * 4) = uVar3;
            }
            if (iVar27 >= iVar34 && (iVar34 != iVar27 || !bVar4)) {
              *(undefined4 *)(lVar14 + -8 + uVar7 * 4) = uVar3;
            }
            auVar41 = (auVar29 | auVar47) ^ auVar49;
            iVar34 = auVar41._4_4_;
            if (iVar34 <= iVar27 && (iVar34 != iVar27 || auVar41._0_4_ <= iVar10)) {
              *(undefined4 *)(lVar14 + -4 + uVar7 * 4) = uVar3;
              *(undefined4 *)(lVar14 + uVar7 * 4) = uVar3;
            }
            uVar7 = uVar7 + 4;
          } while ((lVar11 + 3U & 0xfffffffffffffffc) != uVar7);
        }
        pvVar19 = (void *)((long)pvVar19 + lVar6 * 4);
        iVar18 = iVar18 + 1;
        lVar13 = lVar13 + lVar6 * 4;
        local_a0._0_4_ = top;
      } while (iVar18 != top);
    }
    if ((int)local_a0 < src->h + top) {
      lVar13 = uVar16 - 1;
      auVar44._8_4_ = (int)lVar13;
      auVar44._0_8_ = lVar13;
      auVar44._12_4_ = (int)((ulong)lVar13 >> 0x20);
      lVar14 = (long)pvVar19 + 0xc;
      auVar44 = auVar44 ^ _DAT_005a3240;
      auVar47 = _DAT_005a3340;
      auVar48 = _DAT_005a3350;
      auVar49 = _DAT_005a3240;
      do {
        uVar8 = 0;
        if (0 < left) {
          uVar3 = *local_a8;
          lVar13 = 0;
          auVar23 = auVar48;
          auVar30 = auVar47;
          do {
            auVar41 = auVar23 ^ auVar49;
            iVar18 = auVar44._4_4_;
            if ((bool)(~(auVar41._4_4_ == iVar18 && auVar44._0_4_ < auVar41._0_4_ ||
                        iVar18 < auVar41._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar19 + lVar13) = uVar3;
            }
            if ((auVar41._12_4_ != auVar44._12_4_ || auVar41._8_4_ <= auVar44._8_4_) &&
                auVar41._12_4_ <= auVar44._12_4_) {
              *(undefined4 *)((long)pvVar19 + lVar13 + 4) = uVar3;
            }
            iVar10 = SUB164(auVar30 ^ auVar49,4);
            if (iVar10 <= iVar18 &&
                (iVar10 != iVar18 || SUB164(auVar30 ^ auVar49,0) <= auVar44._0_4_)) {
              *(undefined4 *)((long)pvVar19 + lVar13 + 8) = uVar3;
              *(undefined4 *)((long)pvVar19 + lVar13 + 0xc) = uVar3;
            }
            lVar11 = auVar23._8_8_;
            auVar23._0_8_ = auVar23._0_8_ + 4;
            auVar23._8_8_ = lVar11 + 4;
            lVar11 = auVar30._8_8_;
            auVar30._0_8_ = auVar30._0_8_ + 4;
            auVar30._8_8_ = lVar11 + 4;
            lVar13 = lVar13 + 0x10;
            uVar8 = uVar16;
          } while ((ulong)(left + 3U >> 2) << 4 != lVar13);
        }
        uVar7 = (ulong)src->w;
        uVar17 = (uint)uVar8;
        if ((long)uVar7 < 0xc) {
          uVar5 = src->w + left;
          if ((int)uVar17 < (int)uVar5) {
            do {
              *(undefined4 *)((long)pvVar19 + uVar8 * 4) = local_a8[uVar8 - (long)left];
              uVar8 = uVar8 + 1;
              uVar17 = uVar5;
            } while (uVar5 != uVar8);
          }
        }
        else {
          memcpy((void *)((long)pvVar19 + (long)left * 4),local_a8,uVar7 << 2);
          uVar7 = (ulong)(uint)src->w;
          auVar47 = _DAT_005a3340;
          auVar48 = _DAT_005a3350;
          auVar49 = _DAT_005a3240;
          uVar17 = uVar17 + src->w;
        }
        if ((int)uVar17 < (int)uVar1) {
          uVar3 = local_a8[(long)(int)uVar7 + -1];
          lVar11 = lVar6 - (int)uVar17;
          lVar13 = lVar11 + -1;
          auVar24._8_4_ = (int)lVar13;
          auVar24._0_8_ = lVar13;
          auVar24._12_4_ = (int)((ulong)lVar13 >> 0x20);
          lVar13 = (long)(int)uVar17 * 4 + lVar14;
          uVar8 = 0;
          do {
            auVar31._8_4_ = (int)uVar8;
            auVar31._0_8_ = uVar8;
            auVar31._12_4_ = (int)(uVar8 >> 0x20);
            auVar41 = (auVar31 | auVar48) ^ auVar49;
            iVar18 = SUB164(auVar24 ^ auVar49,0);
            bVar4 = iVar18 < auVar41._0_4_;
            iVar10 = SUB164(auVar24 ^ auVar49,4);
            iVar27 = auVar41._4_4_;
            if ((iVar10 < iVar27 || iVar27 == iVar10 && bVar4) != true) {
              *(undefined4 *)(lVar13 + -0xc + uVar8 * 4) = uVar3;
            }
            if (iVar10 >= iVar27 && (iVar27 != iVar10 || !bVar4)) {
              *(undefined4 *)(lVar13 + -8 + uVar8 * 4) = uVar3;
            }
            auVar41 = (auVar31 | auVar47) ^ auVar49;
            iVar27 = auVar41._4_4_;
            if (iVar27 <= iVar10 && (iVar27 != iVar10 || auVar41._0_4_ <= iVar18)) {
              *(undefined4 *)(lVar13 + -4 + uVar8 * 4) = uVar3;
              *(undefined4 *)(lVar13 + uVar8 * 4) = uVar3;
            }
            uVar8 = uVar8 + 4;
          } while ((lVar11 + 3U & 0xfffffffffffffffc) != uVar8);
        }
        lVar13 = (long)(int)uVar7;
        local_a8 = local_a8 + lVar13;
        pvVar19 = (void *)((long)pvVar19 + lVar6 * 4);
        local_a0._0_4_ = (int)local_a0 + 1;
        lVar14 = lVar14 + lVar6 * 4;
      } while ((int)local_a0 < src->h + top);
    }
    else {
      uVar7 = (ulong)(uint)src->w;
      lVar13 = (long)src->w;
    }
    puVar9 = local_a8 + -lVar13;
    if ((int)local_a0 < iVar2) {
      lVar14 = uVar16 - 1;
      auVar45._8_4_ = (int)lVar14;
      auVar45._0_8_ = lVar14;
      auVar45._12_4_ = (int)((ulong)lVar14 >> 0x20);
      lVar14 = (long)pvVar19 + 0xc;
      auVar45 = auVar45 ^ _DAT_005a3240;
      auVar47 = _DAT_005a3340;
      auVar48 = _DAT_005a3350;
      auVar49 = _DAT_005a3240;
      do {
        uVar8 = 0;
        if (0 < left) {
          uVar3 = *puVar9;
          lVar11 = 0;
          auVar25 = auVar48;
          auVar32 = auVar47;
          do {
            auVar41 = auVar25 ^ auVar49;
            iVar18 = auVar45._4_4_;
            if ((bool)(~(auVar41._4_4_ == iVar18 && auVar45._0_4_ < auVar41._0_4_ ||
                        iVar18 < auVar41._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar19 + lVar11) = uVar3;
            }
            if ((auVar41._12_4_ != auVar45._12_4_ || auVar41._8_4_ <= auVar45._8_4_) &&
                auVar41._12_4_ <= auVar45._12_4_) {
              *(undefined4 *)((long)pvVar19 + lVar11 + 4) = uVar3;
            }
            iVar10 = SUB164(auVar32 ^ auVar49,4);
            if (iVar10 <= iVar18 &&
                (iVar10 != iVar18 || SUB164(auVar32 ^ auVar49,0) <= auVar45._0_4_)) {
              *(undefined4 *)((long)pvVar19 + lVar11 + 8) = uVar3;
              *(undefined4 *)((long)pvVar19 + lVar11 + 0xc) = uVar3;
            }
            lVar15 = auVar25._8_8_;
            auVar25._0_8_ = auVar25._0_8_ + 4;
            auVar25._8_8_ = lVar15 + 4;
            lVar15 = auVar32._8_8_;
            auVar32._0_8_ = auVar32._0_8_ + 4;
            auVar32._8_8_ = lVar15 + 4;
            lVar11 = lVar11 + 0x10;
            uVar8 = uVar16;
          } while ((ulong)(left + 3U >> 2) << 4 != lVar11);
        }
        uVar17 = (uint)uVar8;
        if ((int)uVar7 < 0xc) {
          uVar5 = (int)uVar7 + left;
          if ((int)uVar17 < (int)uVar5) {
            do {
              *(undefined4 *)((long)pvVar19 + uVar8 * 4) =
                   *(undefined4 *)((long)local_a8 + (uVar8 * 4 - ((long)left * 4 + lVar13 * 4)));
              uVar8 = uVar8 + 1;
              uVar17 = uVar5;
            } while (uVar5 != uVar8);
          }
        }
        else {
          memcpy((void *)((long)pvVar19 + (long)left * 4),puVar9,(uVar7 & 0xffffffff) << 2);
          uVar7 = (ulong)(uint)src->w;
          auVar47 = _DAT_005a3340;
          auVar48 = _DAT_005a3350;
          auVar49 = _DAT_005a3240;
          uVar17 = uVar17 + src->w;
        }
        if ((int)uVar17 < (int)uVar1) {
          uVar3 = puVar9[(long)(int)uVar7 + -1];
          lVar15 = lVar6 - (int)uVar17;
          lVar11 = lVar15 + -1;
          auVar26._8_4_ = (int)lVar11;
          auVar26._0_8_ = lVar11;
          auVar26._12_4_ = (int)((ulong)lVar11 >> 0x20);
          lVar11 = (long)(int)uVar17 * 4 + lVar14;
          uVar8 = 0;
          do {
            auVar33._8_4_ = (int)uVar8;
            auVar33._0_8_ = uVar8;
            auVar33._12_4_ = (int)(uVar8 >> 0x20);
            auVar41 = (auVar33 | auVar48) ^ auVar49;
            iVar18 = SUB164(auVar26 ^ auVar49,0);
            bVar4 = iVar18 < auVar41._0_4_;
            iVar10 = SUB164(auVar26 ^ auVar49,4);
            iVar27 = auVar41._4_4_;
            if ((iVar10 < iVar27 || iVar27 == iVar10 && bVar4) != true) {
              *(undefined4 *)(lVar11 + -0xc + uVar8 * 4) = uVar3;
            }
            if (iVar10 >= iVar27 && (iVar27 != iVar10 || !bVar4)) {
              *(undefined4 *)(lVar11 + -8 + uVar8 * 4) = uVar3;
            }
            auVar41 = (auVar33 | auVar47) ^ auVar49;
            iVar27 = auVar41._4_4_;
            if (iVar27 <= iVar10 && (iVar27 != iVar10 || auVar41._0_4_ <= iVar18)) {
              *(undefined4 *)(lVar11 + -4 + uVar8 * 4) = uVar3;
              *(undefined4 *)(lVar11 + uVar8 * 4) = uVar3;
            }
            uVar8 = uVar8 + 4;
          } while ((lVar15 + 3U & 0xfffffffffffffffc) != uVar8);
        }
        pvVar19 = (void *)((long)pvVar19 + lVar6 * 4);
        local_a0._0_4_ = (int)local_a0 + 1;
        lVar14 = lVar14 + lVar6 * 4;
      } while ((int)local_a0 != iVar2);
    }
  }
  local_a8 = puVar9;
  if (type == 2) {
    uVar7 = (ulong)(uint)src->w;
    local_a8 = local_a8 + src->w * top;
    lVar13 = (long)left;
    if (top < 1) {
      iVar18 = 0;
    }
    else {
      iVar10 = 0;
      do {
        uVar8 = 0;
        if (0 < left) {
          puVar9 = local_a8 + lVar13;
          uVar12 = 0;
          do {
            *(undefined4 *)((long)pvVar19 + uVar12 * 4) = *puVar9;
            uVar12 = uVar12 + 1;
            puVar9 = puVar9 + -1;
            uVar8 = uVar16;
          } while (uVar16 != uVar12);
        }
        uVar17 = (uint)uVar8;
        if ((int)uVar7 < 0xc) {
          uVar5 = (int)uVar7 + left;
          if ((int)uVar17 < (int)uVar5) {
            do {
              *(undefined4 *)((long)pvVar19 + uVar8 * 4) = local_a8[uVar8 - lVar13];
              uVar8 = uVar8 + 1;
              uVar17 = uVar5;
            } while (uVar5 != uVar8);
          }
        }
        else {
          memcpy((void *)((long)pvVar19 + lVar13 * 4),local_a8,uVar7 << 2);
          uVar7 = (ulong)(uint)src->w;
          uVar17 = uVar17 + src->w;
        }
        if ((int)uVar17 < (int)uVar1) {
          lVar14 = (long)(int)uVar17;
          iVar18 = (left + -2 + (int)uVar7 * 2) - uVar17;
          do {
            *(undefined4 *)((long)pvVar19 + lVar14 * 4) = local_a8[iVar18];
            lVar14 = lVar14 + 1;
            iVar18 = iVar18 + -1;
          } while (lVar6 != lVar14);
        }
        pvVar19 = (void *)((long)pvVar19 + lVar6 * 4);
        local_a8 = local_a8 + -(long)(int)uVar7;
        iVar10 = iVar10 + 1;
        iVar18 = top;
      } while (iVar10 != top);
    }
    if (iVar18 < src->h + top) {
      do {
        uVar8 = 0;
        if (0 < left) {
          puVar9 = local_a8 + lVar13;
          uVar12 = 0;
          do {
            *(undefined4 *)((long)pvVar19 + uVar12 * 4) = *puVar9;
            uVar12 = uVar12 + 1;
            puVar9 = puVar9 + -1;
            uVar8 = uVar16;
          } while (uVar16 != uVar12);
        }
        uVar17 = (uint)uVar8;
        if ((int)uVar7 < 0xc) {
          uVar5 = (int)uVar7 + left;
          if ((int)uVar17 < (int)uVar5) {
            do {
              *(undefined4 *)((long)pvVar19 + uVar8 * 4) = local_a8[uVar8 - lVar13];
              uVar8 = uVar8 + 1;
              uVar17 = uVar5;
            } while (uVar5 != uVar8);
          }
        }
        else {
          memcpy((void *)((long)pvVar19 + lVar13 * 4),local_a8,uVar7 << 2);
          uVar7 = (ulong)(uint)src->w;
          uVar17 = uVar17 + src->w;
        }
        if ((int)uVar17 < (int)uVar1) {
          lVar14 = (long)(int)uVar17;
          iVar10 = (left + -2 + (int)uVar7 * 2) - uVar17;
          do {
            *(undefined4 *)((long)pvVar19 + lVar14 * 4) = local_a8[iVar10];
            lVar14 = lVar14 + 1;
            iVar10 = iVar10 + -1;
          } while (lVar6 != lVar14);
        }
        local_a8 = local_a8 + (int)uVar7;
        pvVar19 = (void *)((long)pvVar19 + lVar6 * 4);
        iVar18 = iVar18 + 1;
      } while (iVar18 < src->h + top);
    }
    if (iVar18 < iVar2) {
      local_a8 = local_a8 + -(long)((int)uVar7 * 2);
      do {
        uVar8 = 0;
        if (0 < left) {
          puVar9 = local_a8 + lVar13;
          uVar12 = 0;
          do {
            *(undefined4 *)((long)pvVar19 + uVar12 * 4) = *puVar9;
            uVar12 = uVar12 + 1;
            puVar9 = puVar9 + -1;
            uVar8 = uVar16;
          } while (uVar16 != uVar12);
        }
        uVar17 = (uint)uVar8;
        if ((int)uVar7 < 0xc) {
          uVar5 = (int)uVar7 + left;
          if ((int)uVar17 < (int)uVar5) {
            do {
              *(undefined4 *)((long)pvVar19 + uVar8 * 4) = local_a8[uVar8 - lVar13];
              uVar8 = uVar8 + 1;
              uVar17 = uVar5;
            } while (uVar5 != uVar8);
          }
        }
        else {
          memcpy((void *)((long)pvVar19 + lVar13 * 4),local_a8,uVar7 << 2);
          uVar7 = (ulong)(uint)src->w;
          uVar17 = uVar17 + src->w;
        }
        if ((int)uVar17 < (int)uVar1) {
          lVar14 = (long)(int)uVar17;
          iVar10 = (left + -2 + (int)uVar7 * 2) - uVar17;
          do {
            *(undefined4 *)((long)pvVar19 + lVar14 * 4) = local_a8[iVar10];
            lVar14 = lVar14 + 1;
            iVar10 = iVar10 + -1;
          } while (lVar6 != lVar14);
        }
        pvVar19 = (void *)((long)pvVar19 + lVar6 * 4);
        local_a8 = local_a8 + -(long)(int)uVar7;
        iVar18 = iVar18 + 1;
      } while (iVar18 != iVar2);
    }
  }
  return;
}

Assistant:

static void copy_make_border_image(const Mat& src, Mat& dst, int top, int left, int type, T v)
{
    int w = dst.w;
    int h = dst.h;

    const T* ptr = src;
    T* outptr = dst;

    if (type == 0)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = v;
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
    }

    if (type == 1)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
    }

    if (type == 2)
    {
        int y = 0;
        // fill top
        ptr += top * src.w;
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= 2 * src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
    }
}